

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

void ppc_hash64_unmap_hptes(PowerPCCPU_conflict3 *cpu,ppc_hash_pte64_t *hptes,hwaddr ptex,int n)

{
  address_space_unmap_ppc64((cpu->parent_obj).as,hptes,(long)(n << 4),false,(long)(n << 4));
  return;
}

Assistant:

void ppc_hash64_unmap_hptes(PowerPCCPU *cpu, const ppc_hash_pte64_t *hptes,
                            hwaddr ptex, int n)
{
#if 0
    if (cpu->vhyp) {
        PPCVirtualHypervisorClass *vhc =
            PPC_VIRTUAL_HYPERVISOR_GET_CLASS(cpu->vhyp);
        vhc->unmap_hptes(cpu->vhyp, hptes, ptex, n);
        return;
    }
#endif

    address_space_unmap(CPU(cpu)->as, (void *)hptes, n * HASH_PTE_SIZE_64,
                        false, n * HASH_PTE_SIZE_64);
}